

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex>::TestBody
          (CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex> *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *regex;
  AssertHelper local_2d8;
  Message local_2d0 [6];
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_290;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_270;
  DeathTest *gtest_dt;
  AssertHelper local_248;
  Message local_240 [6];
  exception *e_3;
  TrueWithString gtest_msg_3;
  AssertHelper local_1d0;
  Message local_1c8 [6];
  exception *e_2;
  TrueWithString gtest_msg_2;
  AssertHelper local_158;
  Message local_150 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_e0;
  Message local_d8 [6];
  exception *e;
  undefined1 local_98 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex> *this_local;
  
  yamc::checked::recursive_mutex::recursive_mutex
            ((recursive_mutex *)((long)&gtest_msg.value.field_2 + 8));
  memset(local_98,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_98);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_98);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::recursive_mutex_base::lock
                ((recursive_mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xbd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_d8);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_98);
  if ((int)e != 0) goto LAB_001fbaac;
  memset(&e_1,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::recursive_mutex_base::lock
                ((recursive_mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_2.value.field_2 + 8),
                   "Expected: mtx.lock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xbe,pcVar4);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)(gtest_msg_2.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_150);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  if ((int)e != 0) goto LAB_001fbaac;
  memset(&e_2,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_2);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_2);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::recursive_mutex_base::unlock
                ((recursive_mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_1c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_3.value.field_2 + 8),
                   "Expected: mtx.unlock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_2);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xbf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)(gtest_msg_3.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_1c8);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_2);
  if ((int)e != 0) goto LAB_001fbaac;
  memset(&e_3,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_3);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_3);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::recursive_mutex_base::unlock
                ((recursive_mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_dt,
                   "Expected: mtx.unlock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xc0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_248,local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&gtest_dt);
    testing::Message::~Message(local_240);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_3);
  if ((int)e != 0) goto LAB_001fbaac;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)0x27c39e,regex);
    bVar2 = testing::internal::DeathTest::Create
                      ("mtx.unlock()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xc1,&local_270);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_001fb9f1;
    if (local_270 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&local_290,local_270);
      iVar3 = (*local_270->_vptr_DeathTest[2])();
      pDVar1 = local_270;
      if (iVar3 == 0) {
        testing::KilledBySignal::KilledBySignal
                  ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),6);
        iVar3 = (*local_270->_vptr_DeathTest[3])();
        bVar2 = testing::KilledBySignal::operator()
                          ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_001fb99f;
        e._0_4_ = 6;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_270);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            yamc::checked::detail::recursive_mutex_base::unlock
                      ((recursive_mutex_base *)((long)&gtest_msg.value.field_2 + 8));
          }
          (*local_270->_vptr_DeathTest[5])(local_270,2);
          e._0_4_ = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_001fb99f:
        e._0_4_ = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr(&local_290);
      if ((int)e != 0) {
        if ((int)e != 6) goto LAB_001fbaac;
        goto LAB_001fb9f1;
      }
    }
  }
  else {
LAB_001fb9f1:
    testing::Message::Message(local_2d0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xc1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2d8,local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(local_2d0);
  }
  e._0_4_ = 0;
LAB_001fbaac:
  yamc::checked::recursive_mutex::~recursive_mutex
            ((recursive_mutex *)((long)&gtest_msg.value.field_2 + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedRecursiveMutexTest, InvalidUnlock2) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());    // lockcnt = 1
  ASSERT_NO_THROW(mtx.lock());    // lockcnt = 2
  ASSERT_NO_THROW(mtx.unlock());  // lockcnt = 1
  ASSERT_NO_THROW(mtx.unlock());  // lockcnt = 0
  EXPECT_CHECK_FAILURE(mtx.unlock());
}